

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.h
# Opt level: O2

void SerializeKeyOrigin<DataStream>(DataStream *s,KeyOriginInfo hd_keypath)

{
  long lVar1;
  uint *puVar2;
  uchar (*in_RSI) [4];
  uint *path;
  uint *obj;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Serialize<DataStream,_unsigned_char,_4>(s,in_RSI);
  puVar2 = *(uint **)(in_RSI + 4);
  for (obj = *(uint **)(in_RSI + 2); obj != puVar2; obj = obj + 1) {
    DataStream::operator<<(s,obj);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeKeyOrigin(Stream& s, KeyOriginInfo hd_keypath)
{
    s << hd_keypath.fingerprint;
    for (const auto& path : hd_keypath.path) {
        s << path;
    }
}